

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevI::HighPassBase::setup
          (HighPassBase *this,int order,double cutoffFrequency,double rippleDb)

{
  LayoutBase *in_stack_00000008;
  Cascade *in_stack_00000010;
  double in_stack_00000060;
  int in_stack_0000006c;
  AnalogLowPass *in_stack_00000070;
  LayoutBase *in_stack_00000088;
  LayoutBase *in_stack_00000090;
  double in_stack_00000098;
  HighPassTransform *in_stack_000000a0;
  
  AnalogLowPass::design(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
  HighPassTransform::HighPassTransform
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  Cascade::setLayout(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void HighPassBase::setup (int order,
                          double cutoffFrequency,
                          double rippleDb)
{
  m_analogProto.design (order, rippleDb);

  HighPassTransform (cutoffFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}